

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nmos.cc
# Opt level: O2

uint __thiscall chipemu::implementation::nmos::read_nodes(nmos *this,uint16_t *ids,uint count)

{
  bool bVar1;
  ulong uVar2;
  uint uVar3;
  
  uVar3 = 0;
  for (uVar2 = 0; count != uVar2; uVar2 = uVar2 + 1) {
    bVar1 = get_node(this,(uint)ids[uVar2]);
    uVar3 = (uint)bVar1 + uVar3 * 2;
  }
  return uVar3;
}

Assistant:

unsigned
nmos::read_nodes(const uint16_t* ids, unsigned count) const noexcept
{
    unsigned value = 0;

    for (unsigned index = 0; index < count; ++index) {
        value = (value << 1) + (get_node(ids[index]) ? 1 : 0);
    }
    return value;
}